

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring64_bitmap_contains_range(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  bool bVar1;
  uint32_t range_end;
  _Bool _Var2;
  int iVar3;
  ulong uVar4;
  uint32_t range_start;
  ulong uVar5;
  uint8_t max_high48 [6];
  uint8_t min_high48 [6];
  art_iterator_t it;
  uint local_e8;
  ushort local_e4;
  uint32_t local_dc;
  ulong local_d8;
  roaring64_bitmap_t *local_d0;
  uint local_c8;
  ushort local_c4;
  art_iterator_t local_c0;
  
  _Var2 = true;
  if (min < max) {
    local_c8 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
               (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
    local_c4 = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
    local_e8 = (uint)(byte)(max >> 0x38) | ((uint)(max >> 0x20) & 0xff0000) >> 8 |
               (uint)(max >> 0x18) & 0xff0000 | (uint)(max >> 8) & 0xff000000;
    local_e4 = (ushort)(max >> 0x18) & 0xff | (ushort)(max >> 8) & 0xff00;
    art_lower_bound(&local_c0,&r->art,(art_key_chunk_t *)&local_c8);
    if (local_c0.value == (ulong *)0x0) {
      _Var2 = false;
    }
    else {
      uVar4 = (ulong)CONCAT24(local_c0.key._4_2_,local_c0.key._0_4_);
      _Var2 = false;
      if ((((ulong)(ushort)local_c0.key._4_2_ << 0x20 & 0xff0000000000) >> 0x18 |
           ((ulong)(ushort)local_c0.key._4_2_ << 0x20 & 0xff00000000) >> 8 |
           (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
          uVar4 << 0x38) <= min) {
        local_d8 = max - 1 & 0xffffffffffff0000;
        local_dc = (uint)max & 0xffff;
        uVar4 = min & 0xffffffffffff0000;
        local_d0 = r;
        while (local_c0.value != (ulong *)0x0) {
          uVar5 = (ulong)CONCAT24(local_c0.key._4_2_,local_c0.key._0_4_);
          uVar5 = ((ulong)(ushort)local_c0.key._4_2_ << 0x20 & 0xff0000000000) >> 0x18 |
                  ((ulong)(ushort)local_c0.key._4_2_ << 0x20 & 0xff00000000) >> 8 |
                  (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28
                  | uVar5 << 0x38;
          bVar1 = local_d8 < uVar5;
          if (local_d8 < uVar5) {
            return bVar1;
          }
          if (0x10000 < uVar5 - uVar4) {
            return bVar1;
          }
          uVar4 = *local_c0.value;
          iVar3 = art_compare_keys(local_c0.key,(art_key_chunk_t *)&local_c8);
          range_start = 0;
          if (iVar3 == 0) {
            range_start = (uint)min & 0xffff;
          }
          iVar3 = art_compare_keys(local_c0.key,(art_key_chunk_t *)&local_e8);
          if (range_start == 0 && iVar3 != 0) {
            _Var2 = container_is_full(local_d0->containers[uVar4 >> 8],(uint8_t)uVar4);
          }
          else {
            range_end = local_dc;
            if (iVar3 != 0) {
              range_end = 0x10000;
            }
            _Var2 = container_contains_range
                              (local_d0->containers[uVar4 >> 8],range_start,range_end,(uint8_t)uVar4
                              );
          }
          if (_Var2 == false) {
            return bVar1;
          }
          art_iterator_next(&local_c0);
          uVar4 = uVar5;
        }
        _Var2 = uVar4 == local_d8;
      }
    }
  }
  return _Var2;
}

Assistant:

bool roaring64_bitmap_contains_range(const roaring64_bitmap_t *r, uint64_t min,
                                     uint64_t max) {
    if (min >= max) {
        return true;
    }

    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);
    uint64_t max_high48_bits = (max - 1) & 0xFFFFFFFFFFFF0000;  // Inclusive

    art_iterator_t it = art_lower_bound((art_t *)&r->art, min_high48);
    if (it.value == NULL || combine_key(it.key, 0) > min) {
        return false;
    }
    uint64_t prev_high48_bits = min & 0xFFFFFFFFFFFF0000;
    while (it.value != NULL) {
        uint64_t current_high48_bits = combine_key(it.key, 0);
        if (current_high48_bits > max_high48_bits) {
            // We've passed the end of the range with all containers containing
            // the range.
            return true;
        }
        if (current_high48_bits - prev_high48_bits > 0x10000) {
            // There is a gap in the iterator that falls in the range.
            return false;
        }

        leaf_t leaf = (leaf_t)*it.value;
        uint32_t container_min = 0;
        if (compare_high48(it.key, min_high48) == 0) {
            container_min = min_low16;
        }
        uint32_t container_max = 0xFFFF + 1;  // Exclusive
        if (compare_high48(it.key, max_high48) == 0) {
            container_max = max_low16;
        }

        // For the first and last containers we use container_contains_range,
        // for the intermediate containers we can use container_is_full.
        if (container_min == 0 && container_max == 0xFFFF + 1) {
            if (!container_is_full(get_container(r, leaf),
                                   get_typecode(leaf))) {
                return false;
            }
        } else if (!container_contains_range(get_container(r, leaf),
                                             container_min, container_max,
                                             get_typecode(leaf))) {
            return false;
        }
        prev_high48_bits = current_high48_bits;
        art_iterator_next(&it);
    }
    return prev_high48_bits == max_high48_bits;
}